

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterManager.hpp
# Opt level: O0

bool __thiscall
Parameter<std::pair<int,int>>::internalSetData<std::pair<int,int>>
          (Parameter<std::pair<int,_int>_> *this,pair<int,_int> data)

{
  bool bVar1;
  RepType in_RDI;
  bool result;
  pair<int,_int> tmp;
  RepType *in_stack_ffffffffffffffc8;
  pair<int,_int> local_18 [3];
  
  std::pair<int,_int>::pair<int,_int,_true>(local_18);
  bVar1 = ParameterTraits<std::pair<int,_int>_>::convert(in_RDI,in_stack_ffffffffffffffc8);
  if (bVar1) {
    *(undefined1 *)((long)in_RDI + 0x2a) = 0;
    std::pair<int,_int>::operator=((pair<int,_int> *)((long)in_RDI + 0x2c),local_18);
  }
  return bVar1;
}

Assistant:

bool internalSetData(T data) {
    ParamType tmp {};
    bool result = ValueType::convert(data, tmp);
    if (result) {
      empty_ = false;
      data_  = tmp;
    }
    return result;
  }